

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

size_t detect_system_thread_count(void)

{
  char *__nptr;
  size_t sVar1;
  size_t sVar2;
  
  __nptr = getenv("NPROC");
  if ((__nptr != (char *)0x0) && (sVar1 = strtol(__nptr,(char **)0x0,10), 0 < (long)sVar1)) {
    return sVar1;
  }
  sVar2 = sysconf(0x54);
  sVar1 = 2;
  if (0 < (long)sVar2) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t detect_system_thread_count(void) {
    const char* nproc_str;
    long thread_count;
    if ((nproc_str = getenv("NPROC")) &&
        (thread_count = strtol(nproc_str, NULL, 10)) > 0)
        return thread_count;
    if ((thread_count = get_system_thread_count()) > 0)
        return thread_count;
    return DEFAULT_THREAD_COUNT;
}